

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_nloc_w_mips64el(CPUMIPSState_conflict10 *env,uint32_t wd,uint32_t ws)

{
  int64_t iVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (ulong)wd * 0x10;
  lVar3 = (ulong)ws * 0x10;
  iVar1 = msa_nloc_df(2,(long)(int)(env->active_fpu).fpr[ws].fs[0]);
  (env->active_fpu).fpr[wd].fs[0] = (float32)iVar1;
  iVar1 = msa_nloc_df(2,(long)*(int *)((long)(env->active_fpu).fpr + lVar3 + 4));
  *(int *)((long)(env->active_fpu).fpr + lVar2 + 4) = (int)iVar1;
  iVar1 = msa_nloc_df(2,(long)*(int *)((long)(env->active_fpu).fpr + lVar3 + 8));
  *(int *)((long)(env->active_fpu).fpr + lVar2 + 8) = (int)iVar1;
  iVar1 = msa_nloc_df(2,(long)*(int *)((long)(env->active_fpu).fpr + lVar3 + 0xc));
  *(int *)((long)(env->active_fpu).fpr + lVar2 + 0xc) = (int)iVar1;
  return;
}

Assistant:

void helper_msa_nloc_w(CPUMIPSState *env, uint32_t wd, uint32_t ws)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);

    pwd->w[0]  = msa_nloc_df(DF_WORD, pws->w[0]);
    pwd->w[1]  = msa_nloc_df(DF_WORD, pws->w[1]);
    pwd->w[2]  = msa_nloc_df(DF_WORD, pws->w[2]);
    pwd->w[3]  = msa_nloc_df(DF_WORD, pws->w[3]);
}